

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * token_name(int id)

{
  int id_local;
  char *local_8;
  
  if (id == -1) {
    local_8 = "end of file";
  }
  else if (id == 0x80) {
    local_8 = "\'byte\'";
  }
  else if (id == 0x81) {
    local_8 = "\'else\'";
  }
  else if (id == 0x82) {
    local_8 = "\'if\'";
  }
  else if (id == 0x83) {
    local_8 = "\'return\'";
  }
  else if (id == 0x84) {
    local_8 = "\'void\'";
  }
  else if (id == 0x85) {
    local_8 = "\'word\'";
  }
  else if (id == 0x86) {
    local_8 = "identifier";
  }
  else if (id == 0x87) {
    local_8 = "numeric constant";
  }
  else if (id == 0x88) {
    local_8 = "\'==\'";
  }
  else if (id == 0x89) {
    local_8 = "\'!=\'";
  }
  else if (id == 0x8a) {
    local_8 = "\'<=\'";
  }
  else if (id == 0x8b) {
    local_8 = "\'>=\'";
  }
  else {
    token_name::single[1] = (char)id;
    local_8 = token_name::single;
  }
  return local_8;
}

Assistant:

const char* token_name(int id)
{
    static char single[] = "' '";

    switch (id)
    {
        case EOF: return "end of file";

        case BYTE: return "'byte'";
        case ELSE: return "'else'";
        case IF:   return "'if'";
        case RETURN: return "'return'";
        case VOID: return "'void'";
        case WORD: return "'word'";

        case CONSTANT: return "numeric constant";
        case IDENTIFIER: return "identifier";

        case EQ_OP: return "'=='";
        case NE_OP: return "'!='";
        case LE_OP: return "'<='";
        case GE_OP: return "'>='";

        default:
            single[1] = id;
            return single;
    }
}